

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O3

void __thiscall lf::io::VtkFile::ScalarData<char>::ScalarData(ScalarData<char> *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lookup_table)._M_dataplus._M_p = (pointer)&(this->lookup_table).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->lookup_table,"default","");
  return;
}

Assistant:

ScalarData() = default;